

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall
glu::sl::ShaderParser::parseRequirement(ShaderParser *this,CaseRequirement *valueBlock)

{
  string *__lhs;
  bool bVar1;
  int iVar2;
  deUint32 effectiveStages;
  RequiredCapability RVar3;
  undefined8 extraout_RAX;
  ShaderParser *pSVar4;
  RequiredExtension *this_00;
  CaseRequirement req;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  anyExtensionStringList;
  
  advanceToken(this);
  assumeToken(this,TOKEN_IDENTIFIER);
  __lhs = &this->m_curTokenStr;
  bVar1 = std::operator==(__lhs,"extension");
  if (bVar1) {
    anyExtensionStringList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    anyExtensionStringList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    anyExtensionStringList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    advanceToken(this);
    assumeToken(this,TOKEN_LEFT_BRACE);
    advanceToken(this);
    pSVar4 = (ShaderParser *)0x2;
    assumeToken(this,TOKEN_STRING);
    parseStringLiteral_abi_cxx11_((string *)&req,pSVar4,(__lhs->_M_dataplus)._M_p);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &anyExtensionStringList,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req);
    std::__cxx11::string::~string((string *)&req);
    advanceToken(this);
    while (this->m_curToken == TOKEN_VERTICAL_BAR) {
      advanceToken(this);
      pSVar4 = (ShaderParser *)0x2;
      assumeToken(this,TOKEN_STRING);
      parseStringLiteral_abi_cxx11_((string *)&req,pSVar4,(__lhs->_M_dataplus)._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &anyExtensionStringList,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req);
      std::__cxx11::string::~string((string *)&req);
      advanceToken(this);
    }
    if (this->m_curToken != TOKEN_RIGHT_BRACE) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req,
                     "invalid extension list token: ",__lhs);
      parseError(this,(string *)&req);
LAB_008e333a:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req,
                     "invalid requirement value: ",__lhs);
      parseError(this,(string *)&req);
      std::__cxx11::string::~string((string *)&req);
      _Unwind_Resume(extraout_RAX);
    }
    advanceToken(this,TOKEN_RIGHT_BRACE);
    if (this->m_curToken == TOKEN_IN) {
      advanceToken(this);
      effectiveStages = parseShaderStageList(this);
    }
    else {
      effectiveStages = 0xffffffff;
    }
    CaseRequirement::createAnyExtensionRequirement(&req,&anyExtensionStringList,effectiveStages);
    CaseRequirement::operator=(valueBlock,&req);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&req.extension.alternatives);
    this_00 = (RequiredExtension *)&anyExtensionStringList;
  }
  else {
    bVar1 = std::operator==(__lhs,"limit");
    if (bVar1) {
      advanceToken(this);
      pSVar4 = (ShaderParser *)0x2;
      assumeToken(this,TOKEN_STRING);
      parseStringLiteral_abi_cxx11_((string *)&req,pSVar4,(this->m_curTokenStr)._M_dataplus._M_p);
      RVar3.enumName = getGLEnumFromName(this,(string *)&req);
      std::__cxx11::string::~string((string *)&req);
      advanceToken(this);
      assumeToken(this,TOKEN_GREATER);
      advanceToken(this);
      assumeToken(this,TOKEN_INT_LITERAL);
      iVar2 = atoi((this->m_curTokenStr)._M_dataplus._M_p);
      advanceToken(this);
      req.type = TYPE_IMPLEMENTATION_LIMIT;
      RVar3.referenceValue = iVar2;
      req.requiredCap = RVar3;
    }
    else {
      bVar1 = std::operator==(__lhs,"full_glsl_es_100_support");
      if (!bVar1) goto LAB_008e333a;
      advanceToken(this);
      req.requiredCap.enumName = 0;
      req.requiredCap.referenceValue = 0;
      req.type = TYPE_FULL_GLSL_ES_100_SUPPORT;
    }
    req.extension._20_8_ = 0;
    req.extension.alternatives.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    req.extension.alternatives.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    req.extension.alternatives.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    req.extension.alternatives.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    this_00 = &req.extension;
    CaseRequirement::operator=(valueBlock,&req);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this_00->alternatives);
  return;
}

Assistant:

void ShaderParser::parseRequirement (CaseRequirement& valueBlock)
{
	PARSE_DBG(("    parseRequirement()\n"));

	advanceToken();
	assumeToken(TOKEN_IDENTIFIER);

	if (m_curTokenStr == "extension")
	{
		std::vector<std::string>	anyExtensionStringList;
		deUint32					affectedCasesFlags		= -1; // by default all stages

		advanceToken();
		assumeToken(TOKEN_LEFT_BRACE);

		advanceToken();
		assumeToken(TOKEN_STRING);

		anyExtensionStringList.push_back(parseStringLiteral(m_curTokenStr.c_str()));
		advanceToken();

		for (;;)
		{
			if (m_curToken == TOKEN_RIGHT_BRACE)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				assumeToken(TOKEN_STRING);

				anyExtensionStringList.push_back(parseStringLiteral(m_curTokenStr.c_str()));
				advanceToken();
			}
			else
				parseError(string("invalid extension list token: " + m_curTokenStr));
		}
		advanceToken(TOKEN_RIGHT_BRACE);

		if (m_curToken == TOKEN_IN)
		{
			advanceToken();
			affectedCasesFlags = parseShaderStageList();
		}

		valueBlock = CaseRequirement::createAnyExtensionRequirement(anyExtensionStringList, affectedCasesFlags);
	}
	else if (m_curTokenStr == "limit")
	{
		deUint32	limitEnum;
		int			limitValue;

		advanceToken();

		assumeToken(TOKEN_STRING);
		limitEnum = getGLEnumFromName(parseStringLiteral(m_curTokenStr.c_str()));
		advanceToken();

		assumeToken(TOKEN_GREATER);
		advanceToken();

		assumeToken(TOKEN_INT_LITERAL);
		limitValue = parseIntLiteral(m_curTokenStr.c_str());
		advanceToken();

		valueBlock = CaseRequirement::createLimitRequirement(limitEnum, limitValue);
	}
	else if (m_curTokenStr == "full_glsl_es_100_support")
	{
		advanceToken();

		valueBlock = CaseRequirement::createFullGLSLES100SpecificationRequirement();
	}
	else
		parseError(string("invalid requirement value: " + m_curTokenStr));
}